

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool Buffer_resize(Buffer *buffer,size_t newSize)

{
  int val;
  deInt32 dVar1;
  deUint8 *__dest;
  deUint8 *newData;
  size_t newCapacity;
  size_t newSize_local;
  Buffer *buffer_local;
  
  if (buffer->capacity < newSize) {
    val = deMax32((int)buffer->capacity << 1,(int)newSize);
    dVar1 = deAlign32(val,0x200);
    __dest = (deUint8 *)deMalloc((long)dVar1);
    if (__dest == (deUint8 *)0x0) {
      return 0;
    }
    memcpy(__dest,buffer->data,buffer->size);
    deFree(buffer->data);
    buffer->data = __dest;
    buffer->capacity = (long)dVar1;
  }
  buffer->size = newSize;
  return 1;
}

Assistant:

deBool Buffer_resize (Buffer* buffer, size_t newSize)
{
	/* Grow buffer if necessary. */
	if (newSize > buffer->capacity)
	{
		size_t		newCapacity	= (size_t)deAlign32(deMax32(2*(int)buffer->capacity, (int)newSize), 512);
		deUint8*	newData		= (deUint8*)deMalloc(newCapacity);
		if (!newData)
			return DE_FALSE;

		memcpy(newData, buffer->data, buffer->size);
		deFree(buffer->data);
		buffer->data		= newData;
		buffer->capacity	= newCapacity;
	}

	buffer->size = newSize;
	return DE_TRUE;
}